

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_enum_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::AccessorEnumFieldGenerator::AccessorEnumFieldGenerator
          (AccessorEnumFieldGenerator *this,FieldDescriptor *descriptor,Params *params,
          int has_bit_index)

{
  Params *params_00;
  EnumDescriptor *enum_descriptor;
  allocator<char> local_59;
  string local_58;
  int local_24;
  Params *pPStack_20;
  int has_bit_index_local;
  Params *params_local;
  FieldDescriptor *descriptor_local;
  AccessorEnumFieldGenerator *this_local;
  
  local_24 = has_bit_index;
  pPStack_20 = params;
  params_local = (Params *)descriptor;
  descriptor_local = (FieldDescriptor *)this;
  FieldGenerator::FieldGenerator(&this->super_FieldGenerator,params);
  (this->super_FieldGenerator)._vptr_FieldGenerator =
       (_func_int **)&PTR__AccessorEnumFieldGenerator_006fa480;
  this->descriptor_ = (FieldDescriptor *)params_local;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->variables_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->canonical_values_);
  anon_unknown_3::SetEnumVariables(pPStack_20,(FieldDescriptor *)params_local,&this->variables_);
  params_00 = pPStack_20;
  enum_descriptor = FieldDescriptor::enum_type((FieldDescriptor *)params_local);
  anon_unknown_3::LoadEnumValues(params_00,enum_descriptor,&this->canonical_values_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"has",&local_59);
  SetBitOperationVariables(&local_58,local_24,&this->variables_);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  return;
}

Assistant:

AccessorEnumFieldGenerator::
AccessorEnumFieldGenerator(const FieldDescriptor* descriptor,
    const Params& params, int has_bit_index)
  : FieldGenerator(params), descriptor_(descriptor) {
  SetEnumVariables(params, descriptor, &variables_);
  LoadEnumValues(params, descriptor->enum_type(), &canonical_values_);
  SetBitOperationVariables("has", has_bit_index, &variables_);
}